

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageManager.cpp
# Opt level: O1

void __thiscall PageManager::Store(PageManager *this)

{
  pointer ppcVar1;
  
  ppcVar1 = (this->pages).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 !=
      (this->pages).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::ostream::write(&this->field_0x18,(long)*ppcVar1);
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             (this->pages).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void PageManager::Store() {

	for (vector<char *>::iterator i = pages.begin(); i != pages.end(); i++) {
		file.write(*i, page_size);
	}

}